

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModelValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)556>(Result *__return_storage_ptr__,Model *format)

{
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  interface_00;
  bool bVar1;
  int32 modelVersion;
  LinkTypeCase LVar2;
  LinkedModel *pLVar3;
  LinkedModelFile *from;
  StringParameter *pSVar4;
  ulong uVar5;
  allocator local_149;
  undefined1 local_148 [40];
  LinkedModelFile linkedFileSpec;
  string local_f8;
  undefined1 local_d0 [48];
  Result result;
  allocator local_41;
  string local_40;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_40._M_storage._M_storage = (uchar  [8])Specification::Model::description(format);
  bVar1 = Specification::Model::has_linkedmodel((Model *)interface);
  if (bVar1) {
    bVar1 = Specification::Model::isupdatable((Model *)interface);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&result.m_message._M_storage,"LinkedModel cannot be marked as updatable",
                 (allocator *)((long)&result.m_message.super__Rb_tree_node_base._M_right + 7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                     (string *)&result.m_message._M_storage);
      std::__cxx11::string::~string((string *)&result.m_message._M_storage);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&result.m_message.super__Rb_tree_node_base._M_right + 7))
      ;
    }
    else {
      Result::Result((Result *)(local_d0 + 0x28));
      interface_00._M_storage = local_40._M_storage._M_storage;
      modelVersion = Specification::Model::specificationversion((Model *)interface);
      validateModelDescription
                ((Result *)local_d0,(ModelDescription *)interface_00._M_storage,modelVersion);
      Result::operator=((Result *)(local_d0 + 0x28),(Result *)local_d0);
      Result::~Result((Result *)local_d0);
      bVar1 = Result::good((Result *)(local_d0 + 0x28));
      if (bVar1) {
        pLVar3 = Specification::Model::linkedmodel((Model *)interface);
        LVar2 = Specification::LinkedModel::LinkType_case(pLVar3);
        if (LVar2 == LINKTYPE_NOT_SET) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_f8,"LinkedModel.LinkType not set.",
                     (allocator *)&linkedFileSpec.field_0x27);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&linkedFileSpec.field_0x27);
          local_f8._M_storage._M_storage[4] = '\x01';
          local_f8._M_storage._M_storage[5] = '\0';
          local_f8._M_storage._M_storage[6] = '\0';
          local_f8._M_storage._M_storage[7] = '\0';
        }
        else {
          pLVar3 = Specification::Model::linkedmodel((Model *)interface);
          from = Specification::LinkedModel::linkedmodelfile(pLVar3);
          Specification::LinkedModelFile::LinkedModelFile
                    ((LinkedModelFile *)(local_148 + 0x20),from);
          pSVar4 = Specification::LinkedModelFile::linkedmodelfilename
                             ((LinkedModelFile *)(local_148 + 0x20));
          Specification::StringParameter::defaultvalue_abi_cxx11_(pSVar4);
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            pSVar4 = Specification::LinkedModelFile::linkedmodelsearchpath
                               ((LinkedModelFile *)(local_148 + 0x20));
            Specification::StringParameter::defaultvalue_abi_cxx11_(pSVar4);
            std::__cxx11::string::empty();
            Result::Result(__return_storage_ptr__,(Result *)(local_d0 + 0x28));
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_148,
                       "LinkedModel.linkedModelFile.linkedModeFileName.defaultValue cannot be empty."
                       ,&local_149);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_148);
            std::__cxx11::string::~string((string *)local_148);
            std::allocator<char>::~allocator((allocator<char> *)&local_149);
          }
          local_f8._M_storage._M_storage[4] = '\x01';
          local_f8._M_storage._M_storage[5] = '\0';
          local_f8._M_storage._M_storage[6] = '\0';
          local_f8._M_storage._M_storage[7] = '\0';
          Specification::LinkedModelFile::~LinkedModelFile((LinkedModelFile *)(local_148 + 0x20));
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)(local_d0 + 0x28));
        local_f8._M_storage._M_storage[4] = '\x01';
        local_f8._M_storage._M_storage[5] = '\0';
        local_f8._M_storage._M_storage[6] = '\0';
        local_f8._M_storage._M_storage[7] = '\0';
      }
      Result::~Result((Result *)(local_d0 + 0x28));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Model not an a LinkedModel.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_linkedModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if (!format.has_linkedmodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a LinkedModel.");
        }

        if (format.isupdatable()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel cannot be marked as updatable");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        if (format.linkedmodel().LinkType_case() == Specification::LinkedModel::LINKTYPE_NOT_SET) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel.LinkType not set.");
        }

        auto linkedFileSpec = format.linkedmodel().linkedmodelfile();
        if (linkedFileSpec.linkedmodelfilename().defaultvalue().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel.linkedModelFile.linkedModeFileName.defaultValue cannot be empty.");
        }

        if (linkedFileSpec.linkedmodelsearchpath().defaultvalue().empty()) {
            // This is allowed and is the same as having "." or "./" as search path
        }

        return result;
    }